

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_vtab_in(sqlite3_index_info *pIdxInfo,int iCons,int bHandle)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 1;
  uVar3 = 1 << ((byte)iCons & 0x1f);
  if (0x1f < iCons) {
    uVar3 = 0;
  }
  iVar1 = 0;
  if ((*(uint *)&pIdxInfo[1].field_0x14 & uVar3) != 0) {
    iVar1 = iVar2;
    if (bHandle == 0) {
      *(uint *)&pIdxInfo[1].aOrderBy = *(uint *)&pIdxInfo[1].aOrderBy & ~uVar3;
    }
    else if (0 < bHandle) {
      *(uint *)&pIdxInfo[1].aOrderBy = *(uint *)&pIdxInfo[1].aOrderBy | uVar3;
    }
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_vtab_in(sqlite3_index_info *pIdxInfo, int iCons, int bHandle){
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  u32 m = SMASKBIT32(iCons);
  if( m & pHidden->mIn ){
    if( bHandle==0 ){
      pHidden->mHandleIn &= ~m;
    }else if( bHandle>0 ){
      pHidden->mHandleIn |= m;
    }
    return 1;
  }
  return 0;
}